

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database_utils.c
# Opt level: O2

void bake_create_uni_query_db(char *table_name,int field_count,char **field_names,char **query)

{
  int iVar1;
  size_t sVar2;
  char *__s;
  ulong uVar3;
  uint uVar4;
  ulong uVar5;
  int iVar6;
  
  sVar2 = strlen(table_name);
  iVar6 = (int)sVar2 + 0x21;
  uVar5 = 0;
  uVar3 = 0;
  if (0 < field_count) {
    uVar3 = (ulong)(uint)field_count;
  }
  for (; uVar3 != uVar5; uVar5 = uVar5 + 1) {
    sVar2 = strlen(field_names[uVar5]);
    iVar6 = iVar6 + (int)sVar2 + 7;
  }
  sVar2 = (size_t)iVar6;
  __s = (char *)malloc(sVar2);
  *query = __s;
  if (__s != (char *)0x0) {
    iVar6 = snprintf(__s,sVar2,"%s%s%s","CREATE TABLE IF NOT EXISTS ",table_name," ( ");
    uVar4 = field_count - 1;
    uVar3 = 0;
    if (0 < (int)uVar4) {
      uVar3 = (ulong)uVar4;
    }
    for (uVar5 = 0; uVar3 != uVar5; uVar5 = uVar5 + 1) {
      iVar1 = snprintf(*query + iVar6,sVar2,"%s TEXT, ",field_names[uVar5]);
      iVar6 = iVar6 + iVar1;
    }
    iVar1 = snprintf(*query + iVar6,sVar2,"%s TEXT ",field_names[(int)uVar4]);
    snprintf(*query + (iVar1 + iVar6),sVar2,"%s",");");
    return;
  }
  return;
}

Assistant:

void bake_create_uni_query_db(const char *table_name, int field_count, char **field_names, char **query) {
    char *query_beginning = "CREATE TABLE IF NOT EXISTS ";
    char *query_middle = " ( ";
    char *query_ending = ");";

    int query_length = strlen(query_beginning) + strlen(table_name) + strlen(query_middle) + strlen(query_ending) + 1;
    for (int i = 0; i < field_count; i++)
        query_length += strlen(field_names[i]) + 7;

    *query = malloc(query_length * sizeof(char));
    if (*query == NULL) {
        return;
    }
    int insert_pos = 0;

    insert_pos += snprintf(*query, query_length, "%s%s%s", query_beginning, table_name, query_middle);
    for (int i = 0; i < field_count - 1; i++)
        insert_pos += snprintf(*query + insert_pos, query_length, "%s TEXT, ", field_names[i]);
    insert_pos += snprintf(*query + insert_pos, query_length, "%s TEXT ", field_names[field_count - 1]);
    insert_pos += snprintf(*query + insert_pos, query_length, "%s", query_ending);
}